

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O0

void anon_unknown.dwarf_2026d7::writeReadYa
               (Box2i *dw,int tileSizeX,int tileSizeY,char *fileName,
               _func_void_Array2D<Imf_2_5::Rgba>_ptr_int_int *fillPixels)

{
  int iVar1;
  ostream *poVar2;
  Rgba *pRVar3;
  Rgba *pRVar4;
  char *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  TiledRgbaInputFile *in_RDI;
  code *in_R8;
  float fVar5;
  float fVar6;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  Rgba *in_stack_00000028;
  TiledRgbaInputFile *in_stack_00000030;
  Rgba *p2;
  Rgba *p1;
  int x;
  int y;
  TiledRgbaInputFile in;
  TiledRgbaOutputFile out;
  Array2D<Imf_2_5::Rgba> pixels2;
  Array2D<Imf_2_5::Rgba> pixels1;
  int h;
  int w;
  TiledRgbaInputFile *pTVar7;
  TiledRgbaInputFile *this;
  int dxMax;
  int in_stack_fffffffffffffe4c;
  TiledRgbaInputFile *this_00;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  Box2i *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  RgbaChannels rgbaChannels;
  int numThreads;
  int local_c8;
  int local_c4;
  Vec2<float> local_88 [4];
  size_t in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  TiledRgbaOutputFile *in_stack_ffffffffffffffb0;
  Array2D<Imf_2_5::Rgba> local_40;
  int local_28;
  int local_24;
  code *local_20;
  char *local_18;
  undefined4 local_10;
  undefined4 local_c;
  TiledRgbaInputFile *local_8;
  char *pcVar8;
  
  local_24 = (*(int *)&in_RDI->_inputFile - *(int *)&in_RDI->_vptr_TiledRgbaInputFile) + 1;
  local_28 = (*(int *)((long)&in_RDI->_inputFile + 4) -
             *(int *)((long)&in_RDI->_vptr_TiledRgbaInputFile + 4)) + 1;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D
            ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
             ,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D
            ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
             ,CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  (*local_20)(&local_40,local_24,local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  numThreads = (int)poVar2;
  pcVar8 = local_18;
  this = local_8;
  pTVar7 = local_8;
  Imath_2_5::Vec2<float>::Vec2(local_88,0.0,0.0);
  rgbaChannels = (RgbaChannels)pcVar8;
  iVar1 = Imf_2_5::globalThreadCount();
  this_00 = (TiledRgbaInputFile *)local_88;
  dxMax = 0x18;
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
             (LevelMode)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             (LevelRoundingMode)in_stack_fffffffffffffec8,in_stack_fffffffffffffef0,
             (Box2i *)CONCAT44(iVar1,in_stack_fffffffffffffef8),rgbaChannels,
             (float)((ulong)in_stack_fffffffffffffec0 >> 0x20),(V2f *)CONCAT44(local_10,local_c),
             (float)in_stack_fffffffffffffec0,(LineOrder)this,(Compression)pTVar7,numThreads);
  iVar1 = (int)((ulong)pTVar7 >> 0x20);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
            (&local_40,(long)-*(int *)((long)&local_8->_vptr_TiledRgbaInputFile + 4));
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer
            (in_stack_ffffffffffffffb0,(Rgba *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  Imf_2_5::TiledRgbaOutputFile::numXTiles((TiledRgbaOutputFile *)this,iVar1);
  Imf_2_5::TiledRgbaOutputFile::numYTiles((TiledRgbaOutputFile *)this,iVar1);
  Imf_2_5::TiledRgbaOutputFile::writeTiles
            ((TiledRgbaOutputFile *)this_00,in_stack_fffffffffffffe4c,dxMax,
             (int)((ulong)this >> 0x20),(int)this,iVar1);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)this_00);
  poVar2 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
            ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe84);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
            ((Array2D<Imf_2_5::Rgba> *)&stack0xffffffffffffffa8,
             (long)-*(int *)((long)&local_8->_vptr_TiledRgbaInputFile + 4));
  Imf_2_5::TiledRgbaInputFile::setFrameBuffer
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  Imf_2_5::TiledRgbaInputFile::numXTiles(this,iVar1);
  Imf_2_5::TiledRgbaInputFile::numYTiles(this,iVar1);
  Imf_2_5::TiledRgbaInputFile::readTiles
            (this_00,in_stack_fffffffffffffe4c,dxMax,(int)((ulong)this >> 0x20),(int)this,iVar1);
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile(this_00);
  poVar2 = std::operator<<((ostream *)&std::cout,"comparing");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_c4 = 0;
  do {
    if (local_28 <= local_c4) {
      remove(local_18);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)this);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D((Array2D<Imf_2_5::Rgba> *)this);
      return;
    }
    for (local_c8 = 0; local_c8 < local_24; local_c8 = local_c8 + 1) {
      pRVar3 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_40,(long)local_c4);
      pRVar3 = pRVar3 + local_c8;
      pRVar4 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                         ((Array2D<Imf_2_5::Rgba> *)&stack0xffffffffffffffa8,(long)local_c4);
      pRVar4 = pRVar4 + local_c8;
      fVar5 = half::operator_cast_to_float(&pRVar3->r);
      fVar6 = half::operator_cast_to_float(&pRVar4->r);
      if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
        __assert_fail("p1.r == p2.r",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                      ,0xa4,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar5 = half::operator_cast_to_float(&pRVar3->g);
      fVar6 = half::operator_cast_to_float(&pRVar4->g);
      if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
        __assert_fail("p1.g == p2.g",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                      ,0xa5,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar5 = half::operator_cast_to_float(&pRVar3->b);
      fVar6 = half::operator_cast_to_float(&pRVar4->b);
      if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
        __assert_fail("p1.b == p2.b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                      ,0xa6,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
      fVar5 = half::operator_cast_to_float(&pRVar3->a);
      fVar6 = half::operator_cast_to_float(&pRVar4->a);
      if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
        __assert_fail("p1.a == p2.a",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledYa.cpp"
                      ,0xa7,
                      "void (anonymous namespace)::writeReadYa(Box2i &, int, int, const char *, void (*)(Array2D<Rgba> &, int, int))"
                     );
      }
    }
    local_c4 = local_c4 + 1;
  } while( true );
}

Assistant:

void
writeReadYa (Box2i &dw,
	     int tileSizeX,
	     int tileSizeY,
	     const char fileName[],
	     void (* fillPixels) (Array2D<Rgba> &pixels, int w, int h))
{
    int w = dw.max.x - dw.min.x + 1;
    int h = dw.max.y - dw.min.y + 1;
    Array2D <Rgba> pixels1 (h, w);
    Array2D <Rgba> pixels2 (h, w);

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
	TiledRgbaOutputFile out (fileName,
				 tileSizeX, tileSizeY,
				 ONE_LEVEL, ROUND_DOWN,
				 dw, dw,
				 WRITE_YA);

	out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writeTiles (0, out.numXTiles() - 1,  0, out.numYTiles() - 1);
    }

    cout << "reading " << flush;

    {
	TiledRgbaInputFile in (fileName);

	in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);
        in.readTiles (0, in.numXTiles() - 1, 0, in.numYTiles() - 1);
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    const Rgba &p1 = pixels1[y][x];
	    const Rgba &p2 = pixels2[y][x];

	    assert (p1.r == p2.r);
	    assert (p1.g == p2.g);
	    assert (p1.b == p2.b);
	    assert (p1.a == p2.a);
	}
    }

    remove (fileName);
}